

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_CopyTwiceAllocatedStringFieldTest_Test::
TestBody(NoFieldPresenceTest_CopyTwiceAllocatedStringFieldTest_Test *this)

{
  TestAllTypes src;
  TestAllTypes dst;
  undefined1 auStack_568 [688];
  TestAllTypes local_2b8;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)auStack_568,(Arena *)0x0);
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&local_2b8,(Arena *)0x0);
  auStack_568[0x10] = auStack_568[0x10] | 1;
  if ((auStack_568._8_8_ & 1) != 0) {
    auStack_568._8_8_ = *(undefined8 *)(auStack_568._8_8_ & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
            ((ArenaStringPtr *)(auStack_568 + 0x208),(Arena *)auStack_568._8_8_);
  proto2_nofieldpresence_unittest::TestAllTypes::CopyFrom(&local_2b8,(TestAllTypes *)auStack_568);
  proto2_nofieldpresence_unittest::TestAllTypes::CopyFrom(&local_2b8,(TestAllTypes *)auStack_568);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes(&local_2b8);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)auStack_568);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, CopyTwiceAllocatedStringFieldTest) {
  // As an optimization, we maintain a default string in memory and messages
  // with uninitialized fields will be constructed with a pointer to this
  // default string object. The destructor should clear the field only when it
  // is "set" to a nondefault object.
  TestAllTypes src, dst;

  src.mutable_optional_string();  // this causes a memory allocation.

  dst = src;
  dst = src;
}